

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdecompresshelper.cpp
# Opt level: O0

qsizetype __thiscall
QDecompressHelper::readBrotli(QDecompressHelper *this,char *data,qsizetype maxSize)

{
  size_t __n;
  long lVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined4 uVar5;
  BrotliDecoderState *pBVar6;
  unsigned_long *puVar7;
  qsizetype qVar8;
  QByteDataBuffer *this_00;
  long in_RDX;
  long in_RSI;
  QByteDataBuffer *in_RDI;
  long in_FS_OFFSET;
  BrotliDecoderResult result;
  size_t previousUnusedDecodedSize;
  size_t toRead;
  BrotliDecoderState *brotliDecoderState;
  qint64 bytesDecoded;
  size_t unusedDecodedSize;
  uint8_t *decodedPtr;
  size_t encodedBytesRemaining;
  uint8_t *encodedPtr;
  QByteArrayView input;
  QString *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff08;
  uint in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  long local_c8;
  undefined8 in_stack_ffffffffffffff58;
  QChar fillChar;
  QChar local_8a;
  undefined8 local_88;
  char local_70 [48];
  long local_40;
  long local_38;
  qsizetype local_30;
  const_pointer local_28;
  QByteArrayView local_20;
  unsigned_long local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c8 = 0;
  pBVar6 = anon_unknown.dwarf_5c7a61::toBrotliPointer(in_RDI[4].buffers.d.ptr);
  while( true ) {
    uVar4 = in_stack_ffffffffffffff0c & 0xffffff;
    if (((ulong)in_RDI[2].buffers.d.ptr & 1) != 0) {
      uVar4 = CONCAT13(local_c8 < in_RDX,(int3)in_stack_ffffffffffffff0c);
    }
    in_stack_ffffffffffffff0c = uVar4;
    if ((char)(in_stack_ffffffffffffff0c >> 0x18) == '\0') break;
    if (in_RDI[4].buffers.d.size != 0) {
      local_10 = in_RDX - local_c8;
      puVar7 = std::min<unsigned_long>(&local_10,(unsigned_long *)&in_RDI[4].bufferCompleteSize);
      __n = *puVar7;
      memcpy((void *)(in_RSI + local_c8),(void *)in_RDI[4].buffers.d.size,__n);
      local_c8 = __n + local_c8;
      in_RDI[4].bufferCompleteSize = in_RDI[4].bufferCompleteSize - __n;
      in_RDI[4].buffers.d.size = __n + in_RDI[4].buffers.d.size;
      if (in_RDI[4].bufferCompleteSize == 0) {
        in_RDI[4].buffers.d.size = 0;
        *(undefined1 *)&in_RDI[2].buffers.d.ptr = 0;
      }
    }
    iVar3 = BrotliDecoderHasMoreOutput(pBVar6);
    if (iVar3 == 1) {
      qVar8 = BrotliDecoderTakeOutput(pBVar6,&in_RDI[4].bufferCompleteSize);
      in_RDI[4].buffers.d.size = qVar8;
      *(undefined1 *)&in_RDI[2].buffers.d.ptr = 1;
    }
  }
  if (local_c8 != in_RDX) {
    local_20.m_data = (storage_type *)0xaaaaaaaaaaaaaaaa;
    local_20.m_size = -0x5555555555555556;
    local_20 = QByteDataBuffer::readPointer
                         ((QByteDataBuffer *)
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    local_28 = QByteArrayView::data(&local_20);
    local_30 = QByteArrayView::size(&local_20);
    local_38 = in_RSI + local_c8;
    local_40 = in_RDX - local_c8;
    do {
      lVar1 = local_40;
      if (local_40 == 0) {
        QByteArrayView::size(&local_20);
        QByteDataBuffer::advanceReadPointer
                  (in_RDI,CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
        break;
      }
      uVar4 = BrotliDecoderDecompressStream(pBVar6,&local_30,&local_28,&local_40,&local_38,0);
      fillChar.ucs = (char16_t)((ulong)in_stack_ffffffffffffff58 >> 0x30);
      local_c8 = local_c8 + (lVar1 - local_40);
      this_00 = (QByteDataBuffer *)(ulong)uVar4;
      switch(this_00) {
      case (QByteDataBuffer *)0x0:
        goto switchD_002aa4d4_caseD_0;
      case (QByteDataBuffer *)0x1:
        BrotliDecoderDestroyInstance(pBVar6);
        in_RDI[4].buffers.d.ptr = (QByteArray *)0x0;
        QByteDataBuffer::clear(this_00);
        goto LAB_002aa6a9;
      case (QByteDataBuffer *)0x2:
        QByteArrayView::size(&local_20);
        QByteDataBuffer::advanceReadPointer
                  (in_RDI,CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
        local_20 = QByteDataBuffer::readPointer
                             ((QByteDataBuffer *)CONCAT44(uVar4,in_stack_ffffffffffffff18));
        bVar2 = QByteArrayView::isEmpty((QByteArrayView *)0x2aa61f);
        if (bVar2) goto LAB_002aa6a9;
        local_28 = QByteArrayView::constData((QByteArrayView *)0x2aa630);
        local_30 = QByteArrayView::size(&local_20);
        break;
      case (QByteDataBuffer *)0x3:
        iVar3 = BrotliDecoderHasMoreOutput(pBVar6);
        *(bool *)&in_RDI[2].buffers.d.ptr = iVar3 != 0;
      }
    } while( true );
  }
LAB_002aa6a9:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_c8;
switchD_002aa4d4_caseD_0:
  QCoreApplication::translate(local_70,"QHttp","Brotli error: %1",0);
  uVar5 = BrotliDecoderGetErrorCode(pBVar6);
  local_88 = BrotliDecoderErrorString(uVar5);
  QBasicUtf8StringView<false>::QBasicUtf8StringView<const_char_*,_true>
            ((QBasicUtf8StringView<false> *)in_RDI,
             (char **)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  QChar::QChar<char16_t,_true>(&local_8a,L' ');
  QString::arg<QBasicUtf8StringView<false>,_true>
            ((QString *)CONCAT44(uVar4,in_stack_ffffffffffffff18),
             (QBasicUtf8StringView<false> *)in_RDI,in_stack_ffffffffffffff0c,fillChar);
  QString::operator=((QString *)this_00,in_stack_fffffffffffffef8);
  QString::~QString((QString *)0x2aa581);
  QString::~QString((QString *)0x2aa58e);
  local_c8 = -1;
  goto LAB_002aa6a9;
}

Assistant:

qsizetype QDecompressHelper::readBrotli(char *data, const qsizetype maxSize)
{
#if !QT_CONFIG(brotli)
    Q_UNUSED(data);
    Q_UNUSED(maxSize);
    Q_UNREACHABLE();
#else
    qint64 bytesDecoded = 0;

    BrotliDecoderState *brotliDecoderState = toBrotliPointer(decoderPointer);

    while (decoderHasData && bytesDecoded < maxSize) {
        Q_ASSERT(brotliUnconsumedDataPtr || BrotliDecoderHasMoreOutput(brotliDecoderState));
        if (brotliUnconsumedDataPtr) {
            Q_ASSERT(brotliUnconsumedAmount);
            size_t toRead = std::min(size_t(maxSize - bytesDecoded), brotliUnconsumedAmount);
            memcpy(data + bytesDecoded, brotliUnconsumedDataPtr, toRead);
            bytesDecoded += toRead;
            brotliUnconsumedAmount -= toRead;
            brotliUnconsumedDataPtr += toRead;
            if (brotliUnconsumedAmount == 0) {
                brotliUnconsumedDataPtr = nullptr;
                decoderHasData = false;
            }
        }
        if (BrotliDecoderHasMoreOutput(brotliDecoderState) == BROTLI_TRUE) {
            brotliUnconsumedDataPtr =
                    BrotliDecoderTakeOutput(brotliDecoderState, &brotliUnconsumedAmount);
            decoderHasData = true;
        }
    }
    if (bytesDecoded == maxSize)
        return bytesDecoded;
    Q_ASSERT(bytesDecoded < maxSize);

    QByteArrayView input = compressedDataBuffer.readPointer();
    const uint8_t *encodedPtr = reinterpret_cast<const uint8_t *>(input.data());
    size_t encodedBytesRemaining = input.size();

    uint8_t *decodedPtr = reinterpret_cast<uint8_t *>(data + bytesDecoded);
    size_t unusedDecodedSize = size_t(maxSize - bytesDecoded);
    while (unusedDecodedSize > 0) {
        auto previousUnusedDecodedSize = unusedDecodedSize;
        BrotliDecoderResult result = BrotliDecoderDecompressStream(
                brotliDecoderState, &encodedBytesRemaining, &encodedPtr, &unusedDecodedSize,
                &decodedPtr, nullptr);
        bytesDecoded += previousUnusedDecodedSize - unusedDecodedSize;

        switch (result) {
        Q_UNLIKELY_BRANCH
        case BROTLI_DECODER_RESULT_ERROR:
            //: Brotli (compression algorithm) decoding error, e.g. corrupted input or memory allocation problem.
            errorStr = QCoreApplication::translate("QHttp", "Brotli error: %1")
                           .arg(QUtf8StringView{BrotliDecoderErrorString(
                               BrotliDecoderGetErrorCode(brotliDecoderState))});
            return -1;
        case BROTLI_DECODER_RESULT_SUCCESS:
            BrotliDecoderDestroyInstance(brotliDecoderState);
            decoderPointer = nullptr;
            compressedDataBuffer.clear();
            return bytesDecoded;
        case BROTLI_DECODER_RESULT_NEEDS_MORE_INPUT:
            compressedDataBuffer.advanceReadPointer(input.size());
            input = compressedDataBuffer.readPointer();
            if (!input.isEmpty()) {
                encodedPtr = reinterpret_cast<const uint8_t *>(input.constData());
                encodedBytesRemaining = input.size();
                break;
            }
            return bytesDecoded;
        case BROTLI_DECODER_RESULT_NEEDS_MORE_OUTPUT:
            // Some data is leftover inside the brotli decoder, remember for next time
            decoderHasData = BrotliDecoderHasMoreOutput(brotliDecoderState);
            Q_ASSERT(unusedDecodedSize == 0);
            break;
        }
    }
    compressedDataBuffer.advanceReadPointer(input.size() - encodedBytesRemaining);
    return bytesDecoded;
#endif
}